

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall slang::ast::ScalarType::ScalarType(ScalarType *this,Kind scalarKind,bool isSigned)

{
  SourceLocation loc;
  string_view name;
  undefined1 in_DL;
  undefined4 in_ESI;
  size_t in_RDI;
  string_view sVar1;
  char *unaff_retaddr;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  size_t sVar3;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  sVar3 = in_RDI;
  sVar1 = anon_unknown.dwarf_8211f0::getName(Bit);
  SourceLocation::SourceLocation((SourceLocation *)&stack0xffffffffffffffd8);
  name._M_str = unaff_retaddr;
  name._M_len = sVar3;
  loc._4_4_ = in_ESI;
  loc._0_4_ = uVar2;
  IntegralType::IntegralType
            ((IntegralType *)sVar1._M_str,sVar1._M_len._4_4_,name,loc,(bitwidth_t)sVar1._M_len,
             (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
  *(undefined4 *)(in_RDI + 0x50) = in_ESI;
  return;
}

Assistant:

ScalarType::ScalarType(Kind scalarKind, bool isSigned) :
    IntegralType(SymbolKind::ScalarType, getName(scalarKind), SourceLocation(), 1, isSigned,
                 scalarKind != Kind::Bit),
    scalarKind(scalarKind) {
}